

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O3

TPZSavable * __thiscall
TPZRestoreClass<TPZStructMatrixOR<std::complex<double>_>_>::Restore
          (TPZRestoreClass<TPZStructMatrixOR<std::complex<double>_>_> *this)

{
  int iVar1;
  TPZSavable *pTVar2;
  TPZThreadPool *this_00;
  
  pTVar2 = (TPZSavable *)operator_new(0x18);
  *(undefined4 *)&pTVar2[2]._vptr_TPZSavable = 0;
  *(undefined1 *)((long)&pTVar2[2]._vptr_TPZSavable + 4) = 1;
  pTVar2[1]._vptr_TPZSavable =
       (_func_int **)(TPZStructMatrixOR<std::complex<double>>::vtable + 0x168);
  pTVar2->_vptr_TPZSavable = (_func_int **)(TPZStructMatrixOR<std::complex<double>>::vtable + 0x68);
  this_00 = TPZThreadPool::globalInstance();
  iVar1 = TPZThreadPool::threadCount(this_00);
  *(int *)&pTVar2[2]._vptr_TPZSavable = iVar1;
  return pTVar2;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }